

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O2

void anon_unknown.dwarf_4416e::testTiledWithBadAttribute(char *file)

{
  char *file_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Header *pHVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar10;
  int y_level;
  int iVar11;
  char *pcVar12;
  MultiPartInputFile *pMVar13;
  int iVar14;
  TiledInputPart tip;
  TiledInputFile in;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> value;
  InputFile sin;
  undefined4 local_70 [2];
  undefined8 local_68;
  undefined4 *local_60;
  undefined4 *local_58;
  undefined8 local_50;
  char *local_48;
  MultiPartInputFile multiin;
  
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile(&in,file,iVar3);
  value.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  value.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  value.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = local_70;
  local_70[0] = 0;
  local_68 = 0;
  local_50 = 0;
  local_58 = local_60;
  pHVar8 = (Header *)Imf_3_2::TiledInputFile::header();
  doFrameBuffer(&value,pHVar8,(FrameBuffer *)&sin);
  Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in);
  Imf_3_2::TiledInputFile::header();
  lVar9 = Imf_3_2::Header::tileDescription();
  iVar3 = *(int *)(lVar9 + 8);
  iVar5 = 1;
  iVar4 = iVar5;
  if (iVar3 != 0) {
    if (iVar3 == 1) {
      iVar4 = Imf_3_2::TiledInputFile::numXLevels();
    }
    else if (iVar3 == 2) {
      iVar4 = Imf_3_2::TiledInputFile::numXLevels();
      iVar5 = Imf_3_2::TiledInputFile::numYLevels();
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Invalid tile mode ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar3);
      iVar5 = 0;
      std::endl<char,std::char_traits<char>>(poVar10);
      iVar4 = 0;
    }
  }
  iVar3 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  local_48 = file;
  for (; iVar3 != iVar4; iVar3 = iVar3 + 1) {
    for (iVar11 = 0; iVar5 != iVar11; iVar11 = iVar11 + 1) {
      iVar14 = (int)&in;
      iVar6 = Imf_3_2::TiledInputFile::numXTiles(iVar14);
      iVar7 = Imf_3_2::TiledInputFile::numYTiles(iVar14);
      Imf_3_2::TiledInputFile::readTiles(iVar14,0,iVar6 + -1,0,iVar7 + -1,iVar3);
    }
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&sin);
  std::_Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~_Vector_base
            (&value.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>);
  iVar3 = Imf_3_2::globalThreadCount();
  iVar4 = 1;
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(&multiin,local_48,iVar3,true);
  Imf_3_2::TiledInputPart::TiledInputPart(&tip,&multiin,0);
  local_60 = local_70;
  value.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  value.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70[0] = 0;
  local_68 = 0;
  local_50 = 0;
  local_58 = local_60;
  pHVar8 = (Header *)Imf_3_2::TiledInputPart::header();
  doFrameBuffer(&value,pHVar8,(FrameBuffer *)&sin);
  Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&tip);
  Imf_3_2::TiledInputPart::header();
  cVar1 = Imf_3_2::Header::hasType();
  if (cVar1 != '\0') {
    Imf_3_2::TiledInputPart::header();
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_2::Header::type_abi_cxx11_();
    bVar2 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Imf_3_2::TILEDIMAGE_abi_cxx11_);
    if (bVar2) {
      std::operator<<((ostream *)&std::cerr,"tiled image/part didn\'t have tiledimage type\n");
    }
  }
  Imf_3_2::TiledInputPart::header();
  lVar9 = Imf_3_2::Header::tileDescription();
  iVar3 = *(int *)(lVar9 + 8);
  iVar5 = iVar4;
  if (iVar3 != 0) {
    if (iVar3 == 1) {
      iVar5 = Imf_3_2::TiledInputPart::numXLevels();
    }
    else if (iVar3 == 2) {
      iVar5 = Imf_3_2::TiledInputPart::numXLevels();
      iVar4 = Imf_3_2::TiledInputPart::numYLevels();
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Invalid tile mode ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar3);
      iVar4 = 0;
      std::endl<char,std::char_traits<char>>(poVar10);
      iVar5 = 0;
    }
  }
  iVar3 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  if (iVar5 < 1) {
    iVar5 = iVar3;
  }
  for (; iVar3 != iVar5; iVar3 = iVar3 + 1) {
    for (iVar11 = 0; iVar4 != iVar11; iVar11 = iVar11 + 1) {
      iVar14 = (int)&tip;
      iVar6 = Imf_3_2::TiledInputPart::numXTiles(iVar14);
      iVar7 = Imf_3_2::TiledInputPart::numYTiles(iVar14);
      Imf_3_2::TiledInputPart::readTiles(iVar14,0,iVar6 + -1,0,iVar7 + -1,iVar3);
    }
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&sin);
  std::_Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~_Vector_base
            (&value.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>);
  iVar3 = Imf_3_2::globalThreadCount();
  file_00 = local_48;
  pcVar12 = local_48;
  Imf_3_2::InputFile::InputFile(&sin,local_48,iVar3);
  readScanlineThing<Imf_3_2::InputFile>(&sin,SUB81(pcVar12,0));
  Imf_3_2::InputFile::~InputFile(&sin);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&multiin);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile((MultiPartInputFile *)&sin,file_00,iVar3,true);
  pMVar13 = (MultiPartInputFile *)&sin;
  Imf_3_2::InputPart::InputPart((InputPart *)&value,pMVar13,0);
  readScanlineThing<Imf_3_2::InputPart>((InputPart *)&value,SUB81(pMVar13,0));
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&sin);
  checkDeepTypesFailToLoad(file_00);
  Imf_3_2::TiledInputFile::~TiledInputFile(&in);
  return;
}

Assistant:

void
testTiledWithBadAttribute (const char* file)
{
    // it's a tiled file, so it should read as a file
    TiledInputFile in (file);
    readTiledThing (in, false);

    {
        // it should also read using the multipart API (and have its attribute fixed)
        MultiPartInputFile multiin (file);
        TiledInputPart     tip (multiin, 0);
        readTiledThing (tip, true);

        // it should also read using the regular file API as a scanline file
        InputFile sin (file);
        readScanlineThing (sin, false);
    }
    {
        // it should also read using the multipart API as a scanline file
        MultiPartInputFile multiin (file);

        InputPart ip (multiin, 0);
        readScanlineThing (ip, false);
    }

    checkDeepTypesFailToLoad (file);
}